

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O0

void __thiscall wabt::GlobalModuleField::~GlobalModuleField(GlobalModuleField *this)

{
  GlobalModuleField *this_local;
  
  ~GlobalModuleField(this);
  operator_delete(this);
  return;
}

Assistant:

explicit GlobalModuleField(const Location& loc = Location(),
                             string_view name = string_view())
      : ModuleFieldMixin<ModuleFieldType::Global>(loc), global(name) {}